

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanAliasOrAnchor(Scanner *this,bool IsAlias)

{
  byte bVar1;
  byte *Position;
  byte *Position_00;
  Child local_70;
  byte *local_68;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint local_34;
  
  Position = (byte *)this->Current;
  local_34 = this->Column;
  skip(this,1);
  Position_00 = (byte *)this->Current;
  while( true ) {
    bVar1 = *Position_00;
    if ((((bVar1 - 0x2c < 0x32) && ((0x2800000004001U >> ((ulong)(bVar1 - 0x2c) & 0x3f) & 1) != 0))
        || (bVar1 == 0x7b)) || (bVar1 == 0x7d)) break;
    Position_00 = (byte *)skip_ns_char(this,(iterator)Position_00);
    if (Position_00 == (byte *)this->Current) break;
    this->Current = (iterator)Position_00;
    this->Column = this->Column + 1;
  }
  if (Position == Position_00) {
    Twine::Twine((Twine *)&local_70,"Got empty alias or anchor");
    setError(this,(Twine *)&local_70,(iterator)Position);
  }
  else {
    local_58 = &local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_70.decUI = IsAlias ^ 0x15;
    local_60 = (long)Position_00 - (long)Position;
    local_68 = Position;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_70);
    saveSimpleKeyCandidate
              (this,(iterator)
                    (this->TokenQueue).List.Sentinel.
                    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                    .super_node_base_type.Prev,local_34,false);
    this->IsSimpleKeyAllowed = false;
    std::__cxx11::string::~string((string *)&local_58);
  }
  return Position != Position_00;
}

Assistant:

bool Scanner::scanAliasOrAnchor(bool IsAlias) {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  skip(1);
  while(true) {
    if (   *Current == '[' || *Current == ']'
        || *Current == '{' || *Current == '}'
        || *Current == ','
        || *Current == ':')
      break;
    StringRef::iterator i = skip_ns_char(Current);
    if (i == Current)
      break;
    Current = i;
    ++Column;
  }

  if (Start == Current) {
    setError("Got empty alias or anchor", Start);
    return false;
  }

  Token T;
  T.Kind = IsAlias ? Token::TK_Alias : Token::TK_Anchor;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Alias and anchors can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}